

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_comparator.cpp
# Opt level: O3

int bidfx_public_api::price::subject::SubjectComparatorUtils::Compare(Subject *a,Subject *b)

{
  int iVar1;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,SubjectKey::SYMBOL_abi_cxx11_,
             DAT_001ec600 + SubjectKey::SYMBOL_abi_cxx11_);
  Subject::GetComponent(&local_f0,a,&local_50);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,SubjectKey::SYMBOL_abi_cxx11_,
             DAT_001ec600 + SubjectKey::SYMBOL_abi_cxx11_);
  Subject::GetComponent(&local_d0,b,&local_90);
  iVar1 = CompareStrings(&local_f0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,SubjectKey::QUANTITY_abi_cxx11_,
               DAT_001ec520 + SubjectKey::QUANTITY_abi_cxx11_);
    Subject::GetComponent(&local_f0,a,&local_70);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,SubjectKey::QUANTITY_abi_cxx11_,
               DAT_001ec520 + SubjectKey::QUANTITY_abi_cxx11_);
    Subject::GetComponent(&local_d0,b,&local_b0);
    iVar1 = CompareQuantity(&local_f0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (iVar1 == 0) {
      iVar1 = Subject::Compare(a,b);
    }
  }
  return iVar1;
}

Assistant:

int SubjectComparatorUtils::Compare(const Subject& a, const Subject& b)
{
    int cmp = SubjectComparatorUtils::CompareStrings(a.GetComponent(SubjectKey::SYMBOL),
                                                     b.GetComponent(SubjectKey::SYMBOL));

    if (cmp == 0)
    {
        cmp = SubjectComparatorUtils::CompareQuantity(a.GetComponent(SubjectKey::QUANTITY),
                                                      b.GetComponent(SubjectKey::QUANTITY));
        if (cmp == 0)
        {
            return a.Compare(b);
        }
    }

    return cmp;
}